

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,bool raii)

{
  Flags<CommandFlavourFlagBits> *this_00;
  allocator<Flags<CommandFlavourFlagBits>_> *this_01;
  size_t sVar1;
  value_type vVar2;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  pointer ppVar9;
  allocator<char> local_2b3;
  allocator<Flags<CommandFlavourFlagBits>_> local_2b2;
  Flags<CommandFlavourFlagBits> local_2b1;
  Flags<CommandFlavourFlagBits> *local_2b0;
  size_type local_2a8;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_2a0;
  allocator<Flags<CommandFlavourFlagBits>_> local_283;
  Flags<CommandFlavourFlagBits> local_282;
  Flags<CommandFlavourFlagBits> local_281;
  Flags<CommandFlavourFlagBits> *local_280;
  size_type local_278;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_270;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  _Base_ptr local_210;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_208;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_200;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_1f8;
  _Base_ptr local_1f0;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_1e8;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_1e0;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_1d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  Flags<CommandFlavourFlagBits> local_18f;
  CommandFlavourFlagBits local_18e [2];
  value_type local_18c;
  Flags<CommandFlavourFlagBits> local_18b;
  allocator<Flags<CommandFlavourFlagBits>_> local_18a;
  Flags<CommandFlavourFlagBits> local_189;
  Flags<CommandFlavourFlagBits> *local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> raiiFlags;
  undefined1 local_148 [8];
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> flags;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_128;
  undefined4 local_120;
  allocator<Flags<CommandFlavourFlagBits>_> local_11a;
  Flags<CommandFlavourFlagBits> local_119;
  Flags<CommandFlavourFlagBits> *local_118;
  size_type local_110;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_108;
  allocator<Flags<CommandFlavourFlagBits>_> local_ea;
  Flags<CommandFlavourFlagBits> local_e9;
  Flags<CommandFlavourFlagBits> *local_e8;
  size_type local_e0;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_d8;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  undefined1 local_68 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = raii;
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = definition;
  determineVectorParams
            ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              *)local_68,this,&commandData->params);
  sVar6 = std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *)local_68);
  if (sVar6 == 0) {
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar8 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar7);
    bVar5 = isStructureType(this,&(pvVar8->type).type);
    if (bVar5) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,0);
      pvVar8 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar7);
      bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
      if (!bVar5) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (returnParams,1);
        pvVar8 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,*pvVar7);
        bVar5 = isStructureType(this,&(pvVar8->type).type);
        if (bVar5) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,1);
          pvVar8 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&commandData->params,*pvVar7);
          bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
          if (!bVar5) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,2);
            pvVar8 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::operator[](&commandData->params,*pvVar7);
            bVar5 = std::operator==(&(pvVar8->type).type,"uint64_t");
            bVar4 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
            if (bVar5) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_90,returnParams);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::map(&local_c0,
                    (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                     *)local_68);
              Flags<CommandFlavourFlagBits>::Flags(&local_e9,enhanced);
              local_e0 = 1;
              local_e8 = &local_e9;
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_ea);
              __l_04._M_len = local_e0;
              __l_04._M_array = local_e8;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&local_d8,__l_04,&local_ea);
              bVar3 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
              Flags<CommandFlavourFlagBits>::Flags(&local_119,enhanced);
              local_110 = 1;
              local_118 = &local_119;
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_11a);
              __l_03._M_len = local_110;
              __l_03._M_array = local_118;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&local_108,__l_03,&local_11a);
              generateCommandSetInclusive
                        (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                         (bool)(bVar4 & 1),&local_90,&local_c0,false,&local_d8,(bool)(bVar3 & 1),
                         false,&local_108);
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector(&local_108);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_11a);
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector(&local_d8);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_ea);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::~map(&local_c0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_90);
              local_120 = 1;
              goto LAB_00168bb5;
            }
          }
        }
      }
    }
  }
  else if (sVar6 == 1) {
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar8 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar7);
    bVar5 = std::operator==(&(pvVar8->type).type,"void");
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,0);
      pvVar8 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar7);
      bVar5 = isHandleType(this,&(pvVar8->type).type);
      if (!bVar5) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (returnParams,1);
        pvVar8 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,*pvVar7);
        bVar5 = std::operator==(&(pvVar8->type).type,"size_t");
        if (!bVar5) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,1);
          pvVar8 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&commandData->params,*pvVar7);
          bVar5 = std::operator==(&(pvVar8->type).type,"uint32_t");
          if (!bVar5) goto LAB_00168b54;
        }
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (returnParams,2);
        pvVar8 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,*pvVar7);
        bVar5 = std::operator==(&(pvVar8->type).type,"void");
        if (bVar5) {
LAB_0016814e:
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,1);
          vVar2 = *pvVar7;
          local_128._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                        *)local_68);
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                   ::operator->(&local_128);
          if (vVar2 == (ppVar9->second).lenParam) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,2);
            vVar2 = *pvVar7;
            flags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                                   *)local_68);
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                   *)&flags.
                                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (vVar2 == ppVar9->first) {
              this_00 = (Flags<CommandFlavourFlagBits> *)
                        ((long)&raiiFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
              Flags<CommandFlavourFlagBits>::Flags(this_00,enhanced);
              Flags<CommandFlavourFlagBits>::Flags
                        ((Flags<CommandFlavourFlagBits> *)
                         ((long)&raiiFlags.
                                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                         withAllocator);
              this_01 = (allocator<Flags<CommandFlavourFlagBits>_> *)
                        ((long)&raiiFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(this_01);
              __l_02._M_len = 2;
              __l_02._M_array = this_00;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        *)local_148,__l_02,this_01);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator
                        ((allocator<Flags<CommandFlavourFlagBits>_> *)
                         ((long)&raiiFlags.
                                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
              Flags<CommandFlavourFlagBits>::Flags(&local_189,enhanced);
              local_180 = 1;
              local_188 = &local_189;
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_18a);
              __l_01._M_len = local_180;
              __l_01._M_array = local_188;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        *)local_178,__l_01,&local_18a);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_18a);
              pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (returnParams,0);
              pvVar8 = std::
                       vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       ::operator[](&commandData->params,*pvVar7);
              bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
              if (bVar5) {
                Flags<CommandFlavourFlagBits>::Flags(&local_18b,chained);
                std::
                vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::push_back((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             *)local_148,&local_18b);
                local_18e[1] = 2;
                local_18e[0] = withAllocator;
                local_18c.m_mask = (MaskType)operator|(local_18e + 1,local_18e);
                std::
                vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::push_back((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             *)local_148,&local_18c);
                Flags<CommandFlavourFlagBits>::Flags(&local_18f,chained);
                std::
                vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::push_back((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             *)local_178,&local_18f);
              }
              bVar4 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_1a8,returnParams);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::map(&local_1d8,
                    (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                     *)local_68);
              generateCommandSetInclusive
                        (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                         (bool)(bVar4 & 1),&local_1a8,&local_1d8,false,
                         (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          *)local_148,
                         (bool)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_
                               & 1),false,
                         (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          *)local_178);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::~map(&local_1d8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1a8);
              local_120 = 1;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         *)local_178);
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         *)local_148);
              goto LAB_00168bb5;
            }
          }
        }
        else {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,2);
          pvVar8 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&commandData->params,*pvVar7);
          bVar5 = isHandleType(this,&(pvVar8->type).type);
          if (!bVar5) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,2);
            pvVar8 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::operator[](&commandData->params,*pvVar7);
            bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
            if (!bVar5) goto LAB_0016814e;
          }
        }
      }
    }
  }
  else if (sVar6 == 2) {
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar8 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar7);
    bVar5 = std::operator==(&(pvVar8->type).type,"uint32_t");
    if (bVar5) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,1);
      pvVar8 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar7);
      bVar5 = isStructureType(this,&(pvVar8->type).type);
      if (bVar5) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (returnParams,1);
        pvVar8 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,*pvVar7);
        bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
        if (!bVar5) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (returnParams,2);
          pvVar8 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&commandData->params,*pvVar7);
          bVar5 = isStructureType(this,&(pvVar8->type).type);
          if (bVar5) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (returnParams,2);
            pvVar8 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::operator[](&commandData->params,*pvVar7);
            bVar5 = isStructureChainAnchor(this,&(pvVar8->type).type);
            if (!bVar5) {
              local_1e0._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                   ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                            *)local_68);
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                       ::operator->(&local_1e0);
              sVar1 = (ppVar9->second).lenParam;
              local_1f0 = (_Base_ptr)
                          std::
                          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                                   *)local_68);
              local_1e8 = std::
                          next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                    ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                      )local_1f0,1);
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                       ::operator->(&local_1e8);
              if (sVar1 == (ppVar9->second).lenParam) {
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (returnParams,0);
                vVar2 = *pvVar7;
                local_1f8._M_node =
                     (_Base_ptr)
                     std::
                     map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                     ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                              *)local_68);
                ppVar9 = std::
                         _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                         ::operator->(&local_1f8);
                if (vVar2 == (ppVar9->second).lenParam) {
                  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (returnParams,1);
                  vVar2 = *pvVar7;
                  local_200._M_node =
                       (_Base_ptr)
                       std::
                       map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                       ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                                *)local_68);
                  ppVar9 = std::
                           _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                           ::operator->(&local_200);
                  if (vVar2 == ppVar9->first) {
                    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                       (returnParams,2);
                    vVar2 = *pvVar7;
                    local_210 = (_Base_ptr)
                                std::
                                map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                                ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                                         *)local_68);
                    local_208 = std::
                                next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                                          ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                            )local_210,1);
                    ppVar9 = std::
                             _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                             ::operator->(&local_208);
                    bVar4 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
                    if (vVar2 == ppVar9->first) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                (&local_228,returnParams);
                      std::
                      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      ::map(&local_258,
                            (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                             *)local_68);
                      Flags<CommandFlavourFlagBits>::Flags(&local_282,enhanced);
                      Flags<CommandFlavourFlagBits>::Flags(&local_281,withAllocator);
                      local_278 = 2;
                      local_280 = &local_282;
                      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_283);
                      __l_00._M_len = local_278;
                      __l_00._M_array = local_280;
                      std::
                      vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ::vector(&local_270,__l_00,&local_283);
                      bVar3 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
                      Flags<CommandFlavourFlagBits>::Flags(&local_2b1,enhanced);
                      local_2a8 = 1;
                      local_2b0 = &local_2b1;
                      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_2b2);
                      __l._M_len = local_2a8;
                      __l._M_array = local_2b0;
                      std::
                      vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ::vector(&local_2a0,__l,&local_2b2);
                      generateCommandSetInclusive
                                (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                                 (bool)(bVar4 & 1),&local_228,&local_258,false,&local_270,
                                 (bool)(bVar3 & 1),false,&local_2a0);
                      std::
                      vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ::~vector(&local_2a0);
                      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_2b2);
                      std::
                      vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ::~vector(&local_270);
                      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_283);
                      std::
                      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      ::~map(&local_258);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                (&local_228);
                      local_120 = 1;
                      goto LAB_00168bb5;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00168b54:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_2b3)
  ;
  std::allocator<char>::~allocator(&local_2b3);
  local_120 = 1;
LAB_00168bb5:
  std::
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultMultiSuccessWithErrors3Return( std::string const &         name,
                                                                                    CommandData const &         commandData,
                                                                                    size_t                      initialSkipCount,
                                                                                    bool                        definition,
                                                                                    std::vector<size_t> const & returnParams,
                                                                                    bool                        raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  switch ( vectorParams.size() )
  {
    case 0:
      if ( isStructureType( commandData.params[returnParams[0]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( commandData.params[returnParams[2]].type.type == "uint64_t" )
          {
            return generateCommandSetInclusive( name,
                                                commandData,
                                                initialSkipCount,
                                                definition,
                                                returnParams,
                                                vectorParams,
                                                false,
                                                { CommandFlavourFlagBits::enhanced },
                                                raii,
                                                false,
                                                { CommandFlavourFlagBits::enhanced } );
          }
        }
      }
      break;
    case 1:
      if ( ( commandData.params[returnParams[0]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[0]].type.type ) )
      {
        if ( ( commandData.params[returnParams[1]].type.type == "size_t" ) || ( commandData.params[returnParams[1]].type.type == "uint32_t" ) )
        {
          if ( ( commandData.params[returnParams[2]].type.type == "void" ) ||
               ( !isHandleType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) ) )
          {
            if ( returnParams[1] == vectorParams.begin()->second.lenParam )
            {
              if ( returnParams[2] == vectorParams.begin()->first )
              {
                std::vector<CommandFlavourFlags> flags     = { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator };
                std::vector<CommandFlavourFlags> raiiFlags = { CommandFlavourFlagBits::enhanced };
                if ( isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
                {
                  flags.push_back( CommandFlavourFlagBits::chained );
                  flags.push_back( CommandFlavourFlagBits::chained | CommandFlavourFlagBits::withAllocator );
                  raiiFlags.push_back( CommandFlavourFlagBits::chained );
                }
                return generateCommandSetInclusive(
                  name, commandData, initialSkipCount, definition, returnParams, vectorParams, false, flags, raii, false, raiiFlags );
              }
            }
          }
        }
      }
      break;
    case 2:
      if ( commandData.params[returnParams[0]].type.type == "uint32_t" )
      {
        if ( isStructureType( commandData.params[returnParams[1]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
        {
          if ( isStructureType( commandData.params[returnParams[2]].type.type ) && !isStructureChainAnchor( commandData.params[returnParams[2]].type.type ) )
          {
            if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
            {
              if ( returnParams[0] == vectorParams.begin()->second.lenParam )
              {
                if ( returnParams[1] == vectorParams.begin()->first )
                {
                  if ( returnParams[2] == std::next( vectorParams.begin() )->first )
                  {
                    return generateCommandSetInclusive( name,
                                                        commandData,
                                                        initialSkipCount,
                                                        definition,
                                                        returnParams,
                                                        vectorParams,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                                        raii,
                                                        false,
                                                        { CommandFlavourFlagBits::enhanced } );
                  }
                }
              }
            }
          }
        }
      }
      break;
  }
  return "";
}